

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Done_Size(FT_Size size)

{
  FT_Face pFVar1;
  FT_Driver driver_00;
  FT_Memory memory_00;
  FT_ListNode node_00;
  FT_ListNode node;
  FT_Face face;
  FT_Memory memory;
  FT_Driver driver;
  FT_Error error;
  FT_Size size_local;
  
  if (size == (FT_Size)0x0) {
    size_local._4_4_ = 0x24;
  }
  else {
    pFVar1 = size->face;
    if (pFVar1 == (FT_Face)0x0) {
      size_local._4_4_ = 0x23;
    }
    else {
      driver_00 = pFVar1->driver;
      if (driver_00 == (FT_Driver)0x0) {
        size_local._4_4_ = 0x22;
      }
      else {
        memory_00 = (driver_00->root).memory;
        driver._4_4_ = 0;
        node_00 = FT_List_Find(&pFVar1->sizes_list,size);
        if (node_00 == (FT_ListNode)0x0) {
          driver._4_4_ = 0x24;
        }
        else {
          FT_List_Remove(&pFVar1->sizes_list,node_00);
          ft_mem_free(memory_00,node_00);
          if ((pFVar1->size == size) &&
             (pFVar1->size = (FT_Size)0x0, (pFVar1->sizes_list).head != (FT_ListNode)0x0)) {
            pFVar1->size = (FT_Size)((pFVar1->sizes_list).head)->data;
          }
          destroy_size(memory_00,size,driver_00);
        }
        size_local._4_4_ = driver._4_4_;
      }
    }
  }
  return size_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Done_Size( FT_Size  size )
  {
    FT_Error     error;
    FT_Driver    driver;
    FT_Memory    memory;
    FT_Face      face;
    FT_ListNode  node;


    if ( !size )
      return FT_THROW( Invalid_Size_Handle );

    face = size->face;
    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    driver = face->driver;
    if ( !driver )
      return FT_THROW( Invalid_Driver_Handle );

    memory = driver->root.memory;

    error = FT_Err_Ok;
    node  = FT_List_Find( &face->sizes_list, size );
    if ( node )
    {
      FT_List_Remove( &face->sizes_list, node );
      FT_FREE( node );

      if ( face->size == size )
      {
        face->size = NULL;
        if ( face->sizes_list.head )
          face->size = (FT_Size)(face->sizes_list.head->data);
      }

      destroy_size( memory, size, driver );
    }
    else
      error = FT_THROW( Invalid_Size_Handle );

    return error;
  }